

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGenerator.h
# Opt level: O1

void generateSomeValues(size_t size,vector<int,_std::allocator<int>_> *arr)

{
  unsigned_long __res;
  ulong uVar1;
  result_type rVar2;
  size_t __i;
  long lVar3;
  size_t sVar4;
  mt19937 generator;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a8;
  
  local_13a8._M_x[0] = time((time_t *)0x0);
  local_13a8._M_x[0] = local_13a8._M_x[0] & 0xffffffff;
  lVar3 = 1;
  uVar1 = local_13a8._M_x[0];
  do {
    uVar1 = (ulong)(((uint)(uVar1 >> 0x1e) ^ (uint)uVar1) * 0x6c078965 + (int)lVar3);
    local_13a8._M_x[lVar3] = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13a8._M_p = 0x270;
  std::vector<int,_std::allocator<int>_>::resize(arr,size);
  if (size != 0) {
    sVar4 = 0;
    do {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&local_13a8);
      (arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      [sVar4] = (int)rVar2;
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
  }
  return;
}

Assistant:

void generateSomeValues(size_t size, std::vector<int>& arr) {
    std::mt19937 generator(time(0));

    arr.resize(size);

    for (size_t i = 0; i < size; i++)
        arr[i] = generator();
}